

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WithDelete(sqlite3 *db,With *pWith)

{
  int *in_RSI;
  Cte *pCte;
  int i;
  Select *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  int local_14;
  
  if (in_RSI != (int *)0x0) {
    for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
      in_stack_ffffffffffffffe0 = (sqlite3 *)(in_RSI + (long)local_14 * 8 + 4);
      sqlite3ExprListDelete(in_stack_ffffffffffffffe0,(ExprList *)in_stack_ffffffffffffffd8);
      sqlite3SelectDelete(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      sqlite3DbFree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    sqlite3DbFree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WithDelete(sqlite3 *db, With *pWith){
  if( pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      struct Cte *pCte = &pWith->a[i];
      sqlite3ExprListDelete(db, pCte->pCols);
      sqlite3SelectDelete(db, pCte->pSelect);
      sqlite3DbFree(db, pCte->zName);
    }
    sqlite3DbFree(db, pWith);
  }
}